

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O1

void __thiscall
QPropertyDelayedNotifications::notify(QPropertyDelayedNotifications *this,qsizetype index)

{
  ulong uVar1;
  QUntypedPropertyData *pQVar2;
  code *pcVar3;
  ulong uVar4;
  QPropertyObserver *otherT;
  QPropertyObserver *otherT_1;
  ulong *puVar5;
  ulong *puVar6;
  QTaggedPointer<QPropertyObserver,_QPropertyObserverBase::ObserverTag> QVar7;
  long in_FS_OFFSET;
  QPropertyObserver local_48;
  QPropertyObserverPointer local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->delayedProperties[index].d_ptr;
  if ((uVar1 & 1) == 0) {
    if (this->delayedProperties[index].originalBindingData != (QPropertyBindingData *)0x0) {
      this->delayedProperties[index].d_ptr = 0;
      this->delayedProperties[index].originalBindingData = (QPropertyBindingData *)0x0;
      puVar5 = (ulong *)(uVar1 & 0xfffffffffffffffc);
      if (puVar5 != (ulong *)0x0) {
        pQVar2 = this->delayedProperties[index].propertyData;
        do {
          puVar6 = (ulong *)(*puVar5 & 0xfffffffffffffff8);
          if (((uint)*puVar5 & 7) == 1) {
            pcVar3 = (code *)puVar5[2];
            if ((puVar6 == (ulong *)0x0) || (QVar7.d = *puVar6, ((uint)QVar7.d & 7) != 2)) {
              local_48.super_QPropertyObserverBase.field_2.binding = (QPropertyBindingPrivate *)0x0;
              uVar1 = *puVar5;
              *puVar5 = (ulong)((uint)*puVar5 & 7) | (ulong)&local_48;
              uVar4 = uVar1 & 0xfffffffffffffff8;
              if (uVar4 != 0) {
                *(QPropertyObserver **)(uVar4 + 8) = &local_48;
              }
              local_48.super_QPropertyObserverBase.next.d = uVar1 & 0xfffffffffffffff8 | 2;
              local_48.super_QPropertyObserverBase.prev.d = puVar5;
              (*pcVar3)(puVar5,pQVar2);
              QVar7.d = local_48.super_QPropertyObserverBase.next.d;
              local_30.ptr = &local_48;
              QPropertyObserverPointer::unlink_common(&local_30);
            }
            puVar6 = (ulong *)(QVar7.d & 0xfffffffffffffff8);
          }
          puVar5 = puVar6;
        } while (puVar5 != (ulong *)0x0);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void notify(qsizetype index) {
        auto *delayed = delayedProperties + index;
        if (delayed->d_ptr  & QPropertyBindingData::BindingBit)
            return; // already handled
        if (!delayed->originalBindingData)
            return;
        delayed->originalBindingData = nullptr;

        QPropertyObserverPointer observer  { reinterpret_cast<QPropertyObserver *>(delayed->d_ptr & ~QPropertyBindingData::DelayedNotificationBit) };
        delayed->d_ptr = 0;

        if (observer)
            observer.notify(delayed->propertyData);
    }